

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_refs.c
# Opt level: O2

RK_S32 mpp_hevc_frame_rps(HEVCContext *s)

{
  byte *pbVar1;
  ShortTermRPS *pSVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  RefPicList *list;
  ulong uVar6;
  bool bVar7;
  
  pSVar2 = (s->sh).short_term_rps;
  if (pSVar2 == (ShortTermRPS *)0x0) {
    s->rps[1].nb_refs = 0;
    s->rps[0].nb_refs = 0;
    return 0;
  }
  for (lVar4 = 0xd02; lVar4 != 0x1142; lVar4 = lVar4 + 0x40) {
    pbVar1 = (byte *)((long)s->vps_list + lVar4 + -0x30);
    *pbVar1 = *pbVar1 & 0xf9;
  }
  for (lVar4 = 0x898; lVar4 != 0xdc0; lVar4 = lVar4 + 0x108) {
    *(undefined4 *)((long)s->vps_list + lVar4 + -0x30) = 0;
  }
  uVar6 = 0;
  while ((long)uVar6 < (long)pSVar2->num_delta_pocs) {
    uVar5 = 2;
    if (pSVar2->used[uVar6] != '\0') {
      uVar5 = (ulong)(pSVar2->num_negative_pics <= uVar6);
    }
    iVar3 = add_candidate_ref(s,s->rps + uVar5,pSVar2->delta_poc[uVar6] + s->poc,2,
                              (uint)(pSVar2->used[uVar6] != '\0'));
    uVar6 = uVar6 + 1;
    if (iVar3 < 0) {
      return iVar3;
    }
  }
  uVar6 = 0;
  while (uVar6 < (s->sh).long_term_rps.nb_refs) {
    bVar7 = (s->sh).long_term_rps.used[uVar6] != '\0';
    list = s->rps + 4;
    if (bVar7) {
      list = s->rps + 3;
    }
    iVar3 = add_candidate_ref(s,list,(s->sh).long_term_rps.poc[uVar6],4,(uint)bVar7);
    uVar6 = uVar6 + 1;
    if (iVar3 < 0) {
      return iVar3;
    }
  }
  for (lVar4 = 0xcd0; lVar4 != 0x1110; lVar4 = lVar4 + 0x40) {
    mpp_hevc_unref_frame(s,(HEVCFrame *)((long)s->vps_list + lVar4 + -0x30),0);
  }
  if (s->nal_unit_type == NAL_CRA_NUT) {
    lVar4 = 0xd04;
    while( true ) {
      if (lVar4 == 0x1144) {
        return 0;
      }
      if ((*(int *)((long)s->vps_list + lVar4 + -0x30) != 0xff) &&
         (s->poc < *(int *)((long)s->vps_list + lVar4 + -0x50))) break;
      lVar4 = lVar4 + 0x40;
    }
    h265d_flush(s->h265dctx);
    return 0;
  }
  return 0;
}

Assistant:

RK_S32 mpp_hevc_frame_rps(HEVCContext *s)
{

    const ShortTermRPS *short_rps = s->sh.short_term_rps;
    const LongTermRPS  *long_rps  = &s->sh.long_term_rps;
    RefPicList               *rps = s->rps;
    RK_S32  ret;
    RK_U32  i;

    if (!short_rps) {
        rps[0].nb_refs = rps[1].nb_refs = 0;
        return 0;
    }

    /* clear the reference flags on all frames except the current one */
    for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
        HEVCFrame *frame = &s->DPB[i];
        mark_ref(frame, 0);
    }

    for (i = 0; i < NB_RPS_TYPE; i++)
        rps[i].nb_refs = 0;

    /* add the short refs */
    for (i = 0; short_rps && (RK_S32)i < short_rps->num_delta_pocs; i++) {
        int poc = s->poc + short_rps->delta_poc[i];
        int list;

        if (!short_rps->used[i])
            list = ST_FOLL;
        else if (i < short_rps->num_negative_pics)
            list = ST_CURR_BEF;
        else
            list = ST_CURR_AFT;

        ret = add_candidate_ref(s, &rps[list], poc, HEVC_FRAME_FLAG_SHORT_REF, ST_FOLL != list);
        if (ret < 0)
            return ret;
    }

    /* add the long refs */
    for (i = 0; long_rps && i < long_rps->nb_refs; i++) {
        int poc  = long_rps->poc[i];
        int list = long_rps->used[i] ? LT_CURR : LT_FOLL;

        ret = add_candidate_ref(s, &rps[list], poc, HEVC_FRAME_FLAG_LONG_REF, LT_FOLL != list);
        if (ret < 0)
            return ret;
    }
    /* release any frames that are now unused */
    for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
        mpp_hevc_unref_frame(s, &s->DPB[i], 0);
    }
    /*
     * flush for CRA frame if there has frame poc > cur poc in dpb.
     */
    if (IS_CRA(s)) {
        for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
            HEVCFrame *ref = &s->DPB[i];

            if ((ref->slot_index != 0xff) && (ref->poc > s->poc)) {
                h265d_flush(s->h265dctx);
                break;
            }
        }
    }

    return 0;
}